

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

UBool __thiscall
icu_63::SimpleTimeZone::getPreviousTransition
          (SimpleTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  AnnualTimeZoneRule **ppAVar1;
  AnnualTimeZoneRule *pAVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  AnnualTimeZoneRule **ppAVar8;
  UDate *pUVar9;
  AnnualTimeZoneRule **ppAVar10;
  UDate UVar11;
  UDate stdDate;
  UDate dstDate;
  UErrorCode status;
  double local_50;
  UDate local_48;
  double local_40;
  UErrorCode local_34;
  
  if (this->useDaylight == '\0') {
    return '\0';
  }
  local_34 = U_ZERO_ERROR;
  local_48 = base;
  checkTransitionRules(this,&local_34);
  if (((U_ZERO_ERROR < local_34) ||
      (UVar11 = TimeZoneTransition::getTime(this->firstTransition), local_48 < UVar11)) ||
     ((inclusive == '\0' && ((UVar11 == local_48 && (!NAN(UVar11) && !NAN(local_48))))))) {
LAB_001ef751:
    UVar3 = '\0';
  }
  else {
    ppAVar10 = &this->stdRule;
    ppAVar1 = &this->dstRule;
    pAVar2 = this->stdRule;
    uVar4 = TimeZoneRule::getRawOffset(&this->dstRule->super_TimeZoneRule);
    uVar5 = TimeZoneRule::getDSTSavings(&this->dstRule->super_TimeZoneRule);
    iVar6 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                      (local_48,pAVar2,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,
                       &local_50);
    pAVar2 = this->dstRule;
    uVar4 = TimeZoneRule::getRawOffset(&this->stdRule->super_TimeZoneRule);
    uVar5 = TimeZoneRule::getDSTSavings(&this->stdRule->super_TimeZoneRule);
    pUVar9 = &local_40;
    iVar7 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                      (local_48,pAVar2,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,pUVar9)
    ;
    if (((char)iVar6 == '\0') || (((char)iVar7 != '\0' && (local_50 <= local_40)))) {
      if (((char)iVar7 == '\0') ||
         ((ppAVar8 = ppAVar1, (char)iVar6 != '\0' && (local_40 <= local_50)))) goto LAB_001ef751;
    }
    else {
      pUVar9 = &local_50;
      ppAVar8 = ppAVar10;
      ppAVar10 = ppAVar1;
    }
    TimeZoneTransition::setTime(result,*pUVar9);
    TimeZoneTransition::setFrom(result,&(*ppAVar10)->super_TimeZoneRule);
    TimeZoneTransition::setTo(result,&(*ppAVar8)->super_TimeZoneRule);
    UVar3 = '\x01';
  }
  return UVar3;
}

Assistant:

UBool
SimpleTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    if (!useDaylight) {
        return FALSE;
    }

    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    UDate firstTransitionTime = firstTransition->getTime();
    if (base < firstTransitionTime || (!inclusive && base == firstTransitionTime)) {
        return FALSE;
    }
    UDate stdDate, dstDate;
    UBool stdAvail = stdRule->getPreviousStart(base, dstRule->getRawOffset(), dstRule->getDSTSavings(), inclusive, stdDate);
    UBool dstAvail = dstRule->getPreviousStart(base, stdRule->getRawOffset(), stdRule->getDSTSavings(), inclusive, dstDate);
    if (stdAvail && (!dstAvail || stdDate > dstDate)) {
        result.setTime(stdDate);
        result.setFrom((const TimeZoneRule&)*dstRule);
        result.setTo((const TimeZoneRule&)*stdRule);
        return TRUE;
    }
    if (dstAvail && (!stdAvail || dstDate > stdDate)) {
        result.setTime(dstDate);
        result.setFrom((const TimeZoneRule&)*stdRule);
        result.setTo((const TimeZoneRule&)*dstRule);
        return TRUE;
    }
    return FALSE;
}